

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.c
# Opt level: O0

void parse_preproc_line(Source_File *src,Translation_Data *translation_data)

{
  token *__ptr;
  token *hold;
  Translation_Data *translation_data_local;
  Source_File *src_local;
  
  __ptr = get_next_token(src,chonky_jr,'\0');
  switch(__ptr->type) {
  case PKW_IF:
    free(__ptr);
    parse_preproc_if_line(src,translation_data);
    break;
  case PKW_IFDEF:
    free(__ptr);
    parse_preproc_ifdef_line(src,translation_data);
    break;
  case PKW_IFNDEF:
    free(__ptr);
    parse_preproc_ifndef_line(src,translation_data);
    break;
  case PKW_ELIF:
    free(__ptr);
    push_lexing_error("unmatched elif",src,translation_data);
    break;
  case PKW_ELSE:
    free(__ptr);
    push_lexing_error("unmatched else",src,translation_data);
    break;
  case PKW_ENDIF:
    free(__ptr);
    push_lexing_error("unmatched endif",src,translation_data);
    break;
  case PKW_INCLUDE:
    free(__ptr);
    parse_include_line(src,translation_data);
    break;
  case PKW_DEFINE:
    free(__ptr);
    parse_define_line(src,translation_data);
    break;
  case PKW_UNDEF:
    free(__ptr);
    parse_preproc_undef_line(src,translation_data);
    break;
  case PKW_LINE:
    free(__ptr);
    parse_preproc_line_line(src,translation_data);
    break;
  case PKW_ERROR:
    free(__ptr);
    parse_preproc_error_line(src,translation_data);
    break;
  default:
    free(__ptr);
    push_lexing_error("expected a preprocessing directive",src,translation_data);
  }
  return;
}

Assistant:

void parse_preproc_line(struct Source_File *src,struct Translation_Data *translation_data)
{
	struct token *hold;
	hold=get_next_token(src,&chonky_jr[0],0);
	switch(hold->type)
	{
		case PKW_INCLUDE:
			free(hold);
			parse_include_line(src,translation_data);
			return;
		case PKW_DEFINE:
			free(hold);
			parse_define_line(src,translation_data);
			return;
		case PKW_IF:
			free(hold);
			parse_preproc_if_line(src,translation_data);
			return;
		case PKW_IFDEF:
			free(hold);
			parse_preproc_ifdef_line(src,translation_data);
			return;
		case PKW_IFNDEF:
			free(hold);
			parse_preproc_ifndef_line(src,translation_data);
			return;
		case PKW_UNDEF:
			free(hold);
			parse_preproc_undef_line(src,translation_data);
			return;
		case PKW_ENDIF:
			free(hold);
			push_lexing_error("unmatched endif",src,translation_data);
			return;
		case PKW_ELSE:
			free(hold);
			push_lexing_error("unmatched else",src,translation_data);
			return;
		case PKW_ELIF:
			free(hold);
			push_lexing_error("unmatched elif",src,translation_data);
			return;
		case PKW_LINE:
			free(hold);
			parse_preproc_line_line(src,translation_data);
			return;
		case PKW_ERROR:
			free(hold);
			parse_preproc_error_line(src,translation_data);
			return;
		default:
			/*TODO error*/
			free(hold);
			push_lexing_error("expected a preprocessing directive",src,translation_data);
			return;

	}
}